

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWeakSetConstructor
               (DynamicObject *weakSetConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  PropertyString *pPVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakSetConstructor,mode,3,0);
  pJVar1 = (((weakSetConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(weakSetConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakSetConstructor,0xd1,0x1000000000000,2,0,0,0);
  (*(weakSetConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakSetConstructor,0x124,(pJVar1->super_JavascriptLibraryBase).weakSetPrototype.ptr,0,0
             ,0,0);
  pPVar2 = ScriptContext::GetPropertyString(this,0x191);
  (*(weakSetConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakSetConstructor,0x106,pPVar2,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(weakSetConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakSetConstructor(DynamicObject* weakSetConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakSetConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakSet
        // so that the update is in sync with profiler
        JavascriptLibrary* library = weakSetConstructor->GetLibrary();
        ScriptContext* scriptContext = weakSetConstructor->GetScriptContext();
        library->AddMember(weakSetConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(weakSetConstructor, PropertyIds::prototype, library->weakSetPrototype, PropertyNone);
        library->AddMember(weakSetConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::WeakSet), PropertyConfigurable);

        weakSetConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }